

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_stream_socket.hpp
# Opt level: O0

void __thiscall
asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>::initiate_async_send::operator()
          (initiate_async_send *this,
          function<void_(const_std::error_code_&,_unsigned_long)> *handler,const_buffers_1 *buffers,
          message_flags flags)

{
  non_const_lvalue<std::function<void_(const_std::error_code_&,_unsigned_long)>_&> *in_RDI;
  any_io_executor *in_stack_00000018;
  function<void_(const_std::error_code_&,_unsigned_long)> *in_stack_00000020;
  message_flags in_stack_0000002c;
  const_buffers_1 *in_stack_00000030;
  base_implementation_type *in_stack_00000038;
  reactive_socket_service_base *in_stack_00000040;
  non_const_lvalue<std::function<void_(const_std::error_code_&,_unsigned_long)>_&> handler2;
  function<void_(const_std::error_code_&,_unsigned_long)> *in_stack_ffffffffffffff78;
  
  asio::detail::non_const_lvalue<std::function<void_(const_std::error_code_&,_unsigned_long)>_&>::
  non_const_lvalue(in_RDI,in_stack_ffffffffffffff78);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  get_service(*(io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                **)&(in_RDI->value).super__Function_base._M_functor);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  get_implementation(*(io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                       **)&(in_RDI->value).super__Function_base._M_functor);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  get_executor(*(io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                 **)&(in_RDI->value).super__Function_base._M_functor);
  asio::detail::reactive_socket_service_base::
  async_send<asio::const_buffers_1,std::function<void(std::error_code_const&,unsigned_long)>,asio::any_io_executor>
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_0000002c,
             in_stack_00000020,in_stack_00000018);
  asio::detail::non_const_lvalue<std::function<void_(const_std::error_code_&,_unsigned_long)>_&>::
  ~non_const_lvalue((non_const_lvalue<std::function<void_(const_std::error_code_&,_unsigned_long)>_&>
                     *)0x7d5347);
  return;
}

Assistant:

void operator()(WriteHandler&& handler,
        const ConstBufferSequence& buffers,
        socket_base::message_flags flags) const
    {
      // If you get an error on the following line it means that your handler
      // does not meet the documented type requirements for a WriteHandler.
      ASIO_WRITE_HANDLER_CHECK(WriteHandler, handler) type_check;

      detail::non_const_lvalue<WriteHandler> handler2(handler);
      self_->impl_.get_service().async_send(
          self_->impl_.get_implementation(), buffers, flags,
          handler2.value, self_->impl_.get_executor());
    }